

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

ssize_t data_source_read_callback
                  (nghttp2_session *session,int32_t stream_id,uint8_t *buf,size_t length,
                  uint32_t *data_flags,nghttp2_data_source *source,void *userp)

{
  long lVar1;
  void *pvVar2;
  nghttp2_session *local_60;
  size_t nread;
  HTTP *stream;
  Curl_easy *data_s;
  nghttp2_data_source *source_local;
  uint32_t *data_flags_local;
  size_t length_local;
  uint8_t *buf_local;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  if (stream_id == 0) {
    session_local = (nghttp2_session *)0xfffffffffffffe0b;
  }
  else {
    pvVar2 = nghttp2_session_get_stream_user_data(session,stream_id);
    if (pvVar2 == (void *)0x0) {
      session_local = (nghttp2_session *)0xfffffffffffffc7a;
    }
    else {
      lVar1 = *(long *)((long)pvVar2 + 0x198);
      if (lVar1 == 0) {
        session_local = (nghttp2_session *)0xfffffffffffffc7a;
      }
      else {
        local_60 = (nghttp2_session *)length;
        if (*(ulong *)(lVar1 + 0x2d8) < length) {
          local_60 = *(nghttp2_session **)(lVar1 + 0x2d8);
        }
        if (local_60 != (nghttp2_session *)0x0) {
          memcpy(buf,*(void **)(lVar1 + 0x2d0),(size_t)local_60);
          *(long *)(lVar1 + 0x2d0) = (long)&(local_60->streams).table + *(long *)(lVar1 + 0x2d0);
          *(long *)(lVar1 + 0x2d8) = *(long *)(lVar1 + 0x2d8) - (long)local_60;
          if (*(long *)((long)pvVar2 + 0x1168) != -1) {
            *(long *)(lVar1 + 0x2e0) = *(long *)(lVar1 + 0x2e0) - (long)local_60;
          }
        }
        if (*(long *)(lVar1 + 0x2e0) == 0) {
          *data_flags = 1;
        }
        else if (local_60 == (nghttp2_session *)0x0) {
          return -0x1fc;
        }
        session_local = local_60;
      }
    }
  }
  return (ssize_t)session_local;
}

Assistant:

static ssize_t data_source_read_callback(nghttp2_session *session,
                                         int32_t stream_id,
                                         uint8_t *buf, size_t length,
                                         uint32_t *data_flags,
                                         nghttp2_data_source *source,
                                         void *userp)
{
  struct Curl_easy *data_s;
  struct HTTP *stream = NULL;
  size_t nread;
  (void)source;
  (void)userp;

  if(stream_id) {
    /* get the stream from the hash based on Stream ID, stream ID zero is for
       connection-oriented stuff */
    data_s = nghttp2_session_get_stream_user_data(session, stream_id);
    if(!data_s)
      /* Receiving a Stream ID not in the hash should not happen, this is an
         internal error more than anything else! */
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    stream = data_s->req.p.http;
    if(!stream)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
  }
  else
    return NGHTTP2_ERR_INVALID_ARGUMENT;

  nread = CURLMIN(stream->upload_len, length);
  if(nread > 0) {
    memcpy(buf, stream->upload_mem, nread);
    stream->upload_mem += nread;
    stream->upload_len -= nread;
    if(data_s->state.infilesize != -1)
      stream->upload_left -= nread;
  }

  if(stream->upload_left == 0)
    *data_flags = NGHTTP2_DATA_FLAG_EOF;
  else if(nread == 0)
    return NGHTTP2_ERR_DEFERRED;

  H2BUGF(infof(data_s, "data_source_read_callback: "
               "returns %zu bytes stream %u",
               nread, stream_id));

  return nread;
}